

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_59e0::ktxStreamTest_CanCreateAutoKtxFromCppStream_Test::TestBody
          (ktxStreamTest_CanCreateAutoKtxFromCppStream_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  ktxStream *this_00;
  ktxTexture **ppkVar3;
  undefined8 uVar4;
  AssertHelper *this_01;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ktx_error_code_e err;
  KtxTexture<ktxTexture> texture;
  StreambufStream ktxStream;
  char (*in_stack_fffffffffffffeb8) [64];
  AssertionResult *in_stack_fffffffffffffec0;
  KtxTexture<ktxTexture> *in_stack_fffffffffffffec8;
  KtxTexture<ktxTexture> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  int line;
  Message *in_stack_fffffffffffffee0;
  unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffee8;
  Type type;
  StreambufStream *in_stack_fffffffffffffef0;
  string local_f0 [16];
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  AssertionResult *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  AssertionResult local_b8;
  uint local_a4;
  undefined8 local_90;
  AssertionResult local_88;
  undefined8 local_70;
  undefined4 local_5c;
  AssertionResult local_58;
  undefined4 local_48;
  KtxTexture<ktxTexture> local_38;
  StreambufStream local_30;
  
  StreambufStream::StreambufStream
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (openmode)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  type = (Type)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  KtxTexture<ktxTexture>::KtxTexture(&local_38,(nullptr_t)0x0);
  this_00 = StreambufStream::stream((StreambufStream *)0x10f10d);
  ppkVar3 = KtxTexture<ktxTexture>::pHandle<ktxTexture>(&local_38);
  local_48 = ktxTexture_CreateFromStream(this_00,1,ppkVar3);
  local_5c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             (ktx_error_code_e *)in_stack_fffffffffffffec8,
             (ktx_error_code_e *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffef0 =
         (StreambufStream *)
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffec0,(char (*) [53])in_stack_fffffffffffffeb8);
    uVar4 = ktxErrorString(local_48);
    local_70 = uVar4;
    in_stack_fffffffffffffee0 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffec0,(char **)in_stack_fffffffffffffeb8);
    type = (Type)((ulong)uVar4 >> 0x20);
    in_stack_fffffffffffffed8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10f23d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffef0,type,(char *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(char *)in_stack_fffffffffffffed0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (Message *)in_stack_ffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
    testing::Message::~Message((Message *)0x10f297);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f305);
  local_90 = 0;
  testing::internal::CmpHelperNE<(anonymous_namespace)::KtxTexture<ktxTexture>,decltype(nullptr)>
            (in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (void **)in_stack_fffffffffffffec0);
  line = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffed0 =
         (KtxTexture<ktxTexture> *)
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffec0,(char (*) [40])in_stack_fffffffffffffeb8);
    testing::AssertionResult::failure_message((AssertionResult *)0x10f39f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffef0,type,(char *)in_stack_fffffffffffffee0,line
               ,(char *)in_stack_fffffffffffffed0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (Message *)in_stack_ffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
    testing::Message::~Message((Message *)0x10f3f9);
  }
  local_a4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f47d);
  if (local_a4 == 0) {
    uVar2 = StreambufStream::destructed(&local_30);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffec0,(bool *)in_stack_fffffffffffffeb8,(type *)0x10f4bb);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0);
      this_01 = (AssertHelper *)
                testing::Message::operator<<
                          ((Message *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffef0,type,(char *)in_stack_fffffffffffffee0,
                 line,(char *)in_stack_fffffffffffffed0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff40),
                 (Message *)in_stack_ffffffffffffff38);
      testing::internal::AssertHelper::~AssertHelper(this_01);
      std::__cxx11::string::~string(local_f0);
      testing::Message::~Message((Message *)0x10f596);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f621);
    local_a4 = 0;
  }
  KtxTexture<ktxTexture>::~KtxTexture(in_stack_fffffffffffffed0);
  StreambufStream::~StreambufStream((StreambufStream *)this_00);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanCreateAutoKtxFromCppStream)
{
    StreambufStream ktxStream{std::move(_ktx2Streambuf), std::ios::in}; // Or could use the KTx1, no difference
    KtxTexture<ktxTexture> texture;

    KTX_error_code err = ktxTexture_CreateFromStream(ktxStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    EXPECT_EQ(err, KTX_SUCCESS) << "Failed to create auto-detected KTX from C++ stream: " << ktxErrorString(err);
    ASSERT_NE(texture, nullptr) << "Newly-created auto-detected KTX is null";
    EXPECT_TRUE(ktxStream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
}